

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParameters.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureBufferParameters::queryTextureBindingBuffer
          (TextureBufferParameters *this,GLint expected)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1a8;
  GLboolean local_25;
  int local_24;
  GLboolean test_passed;
  long lStack_20;
  GLint result;
  Functions *gl;
  TextureBufferParameters *pTStack_10;
  GLint expected_local;
  TextureBufferParameters *this_local;
  
  gl._4_4_ = expected;
  pTStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = -1;
  local_25 = '\x01';
  (**(code **)(lStack_20 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_BINDING,&local_24);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"Could not query value of GL_TEXTURE_BUFFER_BINDING_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                  ,0xf9);
  if (local_24 != gl._4_4_) {
    local_25 = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [55])"glGetIntegerv(GL_TEXTURE_BINDING_BUFFER_EXT) returned ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_24);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [53])" which is not equal to expected buffer object id == "
                       );
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2c7b265);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  return local_25;
}

Assistant:

glw::GLboolean TextureBufferParameters::queryTextureBindingBuffer(glw::GLint expected)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint	 result	  = -1;
	glw::GLboolean test_passed = true;

	gl.getIntegerv(m_glExtTokens.TEXTURE_BUFFER_BINDING, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query value of GL_TEXTURE_BUFFER_BINDING_EXT");

	if (result != expected)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv(GL_TEXTURE_BINDING_BUFFER_EXT) returned "
						   << result << " which is not equal to expected buffer object id == " << expected << ".\n"
						   << tcu::TestLog::EndMessage;
	}

	return test_passed;
}